

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool __thiscall tinyusdz::Layer::check_unresolved_references(Layer *this,uint32_t max_depth)

{
  bool bVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(this->_prim_specs)._M_h._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      bVar1 = false;
      goto LAB_00217ae0;
    }
    bVar1 = anon_unknown_240::HasReferencesRec(0,(PrimSpec *)(p_Var2 + 5),max_depth);
  } while (!bVar1);
  bVar1 = true;
LAB_00217ae0:
  this->_has_unresolved_references = bVar1;
  return bVar1;
}

Assistant:

bool Layer::check_unresolved_references(const uint32_t max_depth) const {
  bool ret = false;

  for (const auto &item : _prim_specs) {
    if (HasReferencesRec(/* depth */ 0, item.second, max_depth)) {
      ret = true;
      break;
    }
  }

  _has_unresolved_references = ret;
  return _has_unresolved_references;
}